

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SMBusAnalyzerResults::AddResultStringsFromVector
          (SMBusAnalyzerResults *this,string *prefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *postfix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  pointer pbVar1;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  std::operator+(&local_70,prefix,"...");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pbVar1 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while (pbVar1 != (v->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((string *)&local_70);
    pbVar1 = pbVar1 + 1;
    if ((pbVar1 < (v->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) || (postfix->_M_string_length != 0))
    {
      std::__cxx11::string::append((char *)&local_70);
      std::operator+(&local_50,prefix,&local_70);
      std::operator+(&local_90,&local_50,"...");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      std::operator+(&local_90,prefix,&local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  if (postfix->_M_string_length != 0) {
    std::operator+(&local_50,prefix,&local_70);
    std::operator+(&local_90,&local_50,postfix);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void SMBusAnalyzerResults::AddResultStringsFromVector( const std::string& prefix, const std::vector<std::string>& v,
                                                       const std::string& postfix, std::vector<std::string>& results )
{
    results.clear();

    results.push_back( prefix + "..." );

    std::string str;
    for( std::vector<std::string>::const_iterator vi( v.begin() ); vi != v.end(); ++vi )
    {
        str += *vi;

        if( vi + 1 < v.end() || !postfix.empty() )
        {
            str += ", ";
            results.push_back( prefix + str + "..." );
        }
        else
        {
            results.push_back( prefix + str );
        }
    }

    if( !postfix.empty() )
        results.push_back( prefix + str + postfix );
}